

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
          (ShaderImageLoadStoreBase *this,vec4 *v0,vec4 *v1,GLenum internalformat)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  uint uVar2;
  float fVar3;
  Vector<float,_4> VStack_28;
  
  uVar2 = (int)v1 - 0x8f94;
  if (uVar2 < 8) {
    if ((0xbU >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0xb0U >> (uVar2 & 0x1f) & 1) == 0) goto LAB_00a2c368;
      fVar3 = 0.0001;
    }
    else {
      fVar3 = 0.01;
    }
    tcu::Vector<float,_4>::Vector(&VStack_28,fVar3);
    bVar1 = ColorEqual(this,v0,&VStack_28,(vec4 *)CONCAT44(in_register_0000000c,internalformat));
  }
  else {
LAB_00a2c368:
    fVar3 = *(float *)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper;
    if ((((fVar3 != v0->m_data[0]) || (NAN(fVar3) || NAN(v0->m_data[0]))) ||
        (fVar3 = *(float *)((long)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper + 4),
        fVar3 != v0->m_data[1])) ||
       (((NAN(fVar3) || NAN(v0->m_data[1]) ||
         (fVar3 = *(float *)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl,
         fVar3 != v0->m_data[2])) || (NAN(fVar3) || NAN(v0->m_data[2]))))) {
      bVar1 = false;
    }
    else {
      bVar1 = (bool)(-(v0->m_data[3] ==
                      *(float *)((long)&(this->super_SubcaseBase).super_GLWrapper.
                                        super_CallLogWrapper.m_gl + 4)) & 1);
    }
  }
  return bVar1;
}

Assistant:

bool Equal(const vec4& v0, const vec4& v1, GLenum internalformat)
	{
		if (internalformat == GL_RGBA16_SNORM || internalformat == GL_RG16_SNORM || internalformat == GL_R16_SNORM)
		{
			return ColorEqual(v0, v1, vec4(0.0001f));
		}
		else if (internalformat == GL_RGBA8_SNORM || internalformat == GL_RG8_SNORM || internalformat == GL_R8_SNORM)
		{
			return ColorEqual(v0, v1, vec4(0.01f));
		}
		return (v0[0] == v1[0]) && (v0[1] == v1[1]) && (v0[2] == v1[2]) && (v0[3] == v1[3]);
	}